

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

void aom_quantize_b_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  tran_low_t abs_dqcoeff;
  int dequant;
  int iwt;
  int64_t tmp;
  qm_val_t wt_1;
  long in_stack_00000028;
  int tmp32;
  int abs_coeff;
  int coeff_sign;
  int coeff_1;
  int rc_1;
  int coeff;
  qm_val_t wt;
  int rc;
  int eob;
  int non_zero_count;
  int i;
  int nzbins [2];
  int zbins [2];
  uint local_90;
  uint local_8c;
  uint local_88;
  int local_4c;
  int local_48;
  int local_44;
  int local_40 [4];
  long local_30;
  long local_28;
  long local_20;
  long local_10;
  long local_8;
  
  bVar6 = (byte)rc;
  local_40[2] = (int)*in_RDX + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f);
  local_40[3] = (int)in_RDX[1] + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f);
  local_40[0] = -local_40[2];
  local_40[1] = -local_40[3];
  local_48 = (int)in_RSI;
  local_4c = -1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(in_stack_00000008,0,in_RSI << 2);
  memset(in_stack_00000010,0,local_10 << 2);
  local_44 = (int)local_10;
  while (local_44 = local_44 + -1, -1 < local_44) {
    iVar1 = (int)*(short *)(in_stack_00000028 + (long)local_44 * 2);
    if (_coeff_1 == 0) {
      local_88 = 0x20;
    }
    else {
      local_88 = (uint)*(byte *)(_coeff_1 + iVar1);
    }
    iVar2 = *(int *)(local_8 + (long)iVar1 * 4) * local_88;
    if ((local_40[(long)(int)(uint)(iVar1 != 0) + 2] * 0x20 <= iVar2) ||
       (iVar2 <= local_40[(int)(uint)(iVar1 != 0)] * 0x20)) break;
    local_48 = local_48 + -1;
  }
  for (local_44 = 0; local_44 < local_48; local_44 = local_44 + 1) {
    iVar1 = (int)*(short *)(in_stack_00000028 + (long)local_44 * 2);
    uVar4 = *(uint *)(local_8 + (long)iVar1 * 4);
    uVar3 = 0;
    if ((int)uVar4 < 0) {
      uVar3 = 0xffffffff;
    }
    iVar2 = (uVar4 ^ uVar3) - uVar3;
    if (_coeff_1 == 0) {
      local_8c = 0x20;
    }
    else {
      local_8c = (uint)*(byte *)(_coeff_1 + iVar1);
    }
    if (local_40[(long)(int)(uint)(iVar1 != 0) + 2] * 0x20 <= (int)(iVar2 * local_8c)) {
      iVar2 = clamp(iVar2 + ((int)*(short *)(local_20 + (long)(int)(uint)(iVar1 != 0) * 2) +
                             ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f)),-0x8000,0x7fff);
      lVar5 = (ulong)(byte)local_8c * (long)iVar2;
      uVar4 = (uint)(((lVar5 * *(short *)(local_28 + (long)(int)(uint)(iVar1 != 0) * 2) >> 0x10) +
                     lVar5) * (long)*(short *)(local_30 + (long)(int)(uint)(iVar1 != 0) * 2) >>
                    (0x15 - bVar6 & 0x3f));
      *(uint *)((long)in_stack_00000008 + (long)iVar1 * 4) = (uVar4 ^ uVar3) - uVar3;
      if (_coeff == 0) {
        local_90 = 0x20;
      }
      else {
        local_90 = (uint)*(byte *)(_coeff + iVar1);
      }
      *(uint *)((long)in_stack_00000010 + (long)iVar1 * 4) =
           ((int)(uVar4 * ((int)((int)*(short *)(_dequant + (long)(int)(uint)(iVar1 != 0) * 2) *
                                 local_90 + 0x10) >> 5)) >> (bVar6 & 0x1f) ^ uVar3) - uVar3;
      if (uVar4 != 0) {
        local_4c = local_44;
      }
    }
  }
  *(short *)tmp = (short)local_4c + 1;
  return;
}

Assistant:

void aom_quantize_b_helper_c(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                             const int16_t *zbin_ptr, const int16_t *round_ptr,
                             const int16_t *quant_ptr,
                             const int16_t *quant_shift_ptr,
                             tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                             const int16_t *dequant_ptr, uint16_t *eob_ptr,
                             const int16_t *scan, const int16_t *iscan,
                             const qm_val_t *qm_ptr, const qm_val_t *iqm_ptr,
                             const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int i, non_zero_count = (int)n_coeffs, eob = -1;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;

    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS)) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS)))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32;

    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      int64_t tmp =
          clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
      tmp *= wt;
      tmp32 = (int)(((((tmp * quant_ptr[rc != 0]) >> 16) + tmp) *
                     quant_shift_ptr[rc != 0]) >>
                    (16 - log_scale + AOM_QM_BITS));  // quantization
      qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
      const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);

      if (tmp32) eob = i;
    }
  }
  *eob_ptr = eob + 1;
}